

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O2

Function * __thiscall wasm::ImportInfo::getImportedFunction(ImportInfo *this,Name module,Name base)

{
  Function *pFVar1;
  pointer ppFVar2;
  
  ppFVar2 = (this->importedFunctions).
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppFVar2 ==
        (this->importedFunctions).
        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (Function *)0x0;
    }
    pFVar1 = *ppFVar2;
    if (((pFVar1->super_Importable).module.super_IString.str._M_str ==
         module.super_IString.str._M_str) &&
       ((pFVar1->super_Importable).base.super_IString.str._M_str == base.super_IString.str._M_str))
    break;
    ppFVar2 = ppFVar2 + 1;
  }
  return pFVar1;
}

Assistant:

Function* getImportedFunction(Name module, Name base) {
    for (auto* import : importedFunctions) {
      if (import->module == module && import->base == base) {
        return import;
      }
    }
    return nullptr;
  }